

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_check_duplicate_extensions(CBS *cbs)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  ulong new_size;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Array<unsigned_short> extension_types;
  CBS extensions;
  uint16_t type;
  CBS local_68;
  CBS local_58;
  CBS local_40;
  
  local_58.data = cbs->data;
  local_58.len = cbs->len;
  new_size = 0;
  while (local_58.len != 0) {
    iVar4 = CBS_get_u16(&local_58,(uint16_t *)&local_40);
    if (iVar4 == 0) {
      return false;
    }
    iVar4 = CBS_get_u16_length_prefixed(&local_58,&local_68);
    new_size = new_size + 1;
    if (iVar4 == 0) {
      return false;
    }
  }
  if (new_size == 0) {
    return true;
  }
  local_68.data = (uint8_t *)0x0;
  local_68.len = 0;
  bVar3 = Array<unsigned_short>::InitUninitialized((Array<unsigned_short> *)&local_68,new_size);
  if (bVar3) {
    local_58.data = cbs->data;
    local_58.len = cbs->len;
    if (local_68.len == 0) {
      if (local_58.len != 0) goto LAB_00137167;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        iVar4 = CBS_get_u16(&local_58,(uint16_t *)(local_68.data + lVar6));
        if ((iVar4 == 0) ||
           (iVar4 = CBS_get_u16_length_prefixed(&local_58,&local_40), puVar2 = local_68.data,
           iVar4 == 0)) goto LAB_00137146;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 2;
      } while (uVar7 < local_68.len);
      if (local_58.len != 0) {
LAB_00137167:
        __assert_fail("CBS_len(&extensions) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x58,"bool bssl::tls1_check_duplicate_extensions(const CBS *)");
      }
      if (local_68.len != 0) {
        puVar1 = local_68.data + local_68.len * 2;
        lVar6 = 0x3f;
        if (local_68.len != 0) {
          for (; local_68.len >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::__introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_68.data,puVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar2,puVar1);
      }
    }
    bVar3 = true;
    if (new_size != 1) {
      uVar7 = 2;
      if (2 < new_size) {
        uVar7 = new_size;
      }
      uVar5 = 1;
      do {
        if ((uVar5 - local_68.len == 1) || (local_68.len + (local_68.len == 0) == uVar5)) {
          abort();
        }
        if (*(short *)(local_68.data + (uVar5 - 1) * 2) == *(short *)(local_68.data + uVar5 * 2))
        goto LAB_00137146;
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      bVar3 = new_size <= uVar5;
    }
  }
  else {
LAB_00137146:
    bVar3 = false;
  }
  OPENSSL_free(local_68.data);
  return bVar3;
}

Assistant:

static bool tls1_check_duplicate_extensions(const CBS *cbs) {
  // First pass: count the extensions.
  size_t num_extensions = 0;
  CBS extensions = *cbs;
  while (CBS_len(&extensions) > 0) {
    uint16_t type;
    CBS extension;

    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    num_extensions++;
  }

  if (num_extensions == 0) {
    return true;
  }

  Array<uint16_t> extension_types;
  if (!extension_types.InitForOverwrite(num_extensions)) {
    return false;
  }

  // Second pass: gather the extension types.
  extensions = *cbs;
  for (size_t i = 0; i < extension_types.size(); i++) {
    CBS extension;

    if (!CBS_get_u16(&extensions, &extension_types[i]) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      // This should not happen.
      return false;
    }
  }
  assert(CBS_len(&extensions) == 0);

  // Sort the extensions and make sure there are no duplicates.
  std::sort(extension_types.begin(), extension_types.end());
  for (size_t i = 1; i < num_extensions; i++) {
    if (extension_types[i - 1] == extension_types[i]) {
      return false;
    }
  }

  return true;
}